

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  
  this->testInfo = _testInfo;
  uVar1 = (_totals->assertions).failed;
  uVar2 = (_totals->assertions).failedButOk;
  uVar3 = (_totals->assertions).skipped;
  uVar4 = (_totals->testCases).passed;
  uVar5 = (_totals->testCases).failed;
  uVar6 = (_totals->testCases).failedButOk;
  uVar7 = (_totals->testCases).skipped;
  (this->totals).assertions.passed = (_totals->assertions).passed;
  (this->totals).assertions.failed = uVar1;
  (this->totals).assertions.failedButOk = uVar2;
  (this->totals).assertions.skipped = uVar3;
  (this->totals).testCases.passed = uVar4;
  (this->totals).testCases.failed = uVar5;
  (this->totals).testCases.failedButOk = uVar6;
  (this->totals).testCases.skipped = uVar7;
  std::__cxx11::string::string((string *)&this->stdOut,(string *)_stdOut);
  std::__cxx11::string::string((string *)&this->stdErr,(string *)_stdErr);
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string&& _stdOut,
                                   std::string&& _stdErr,
                                   bool _aborting )
    : testInfo( &_testInfo ),
        totals( _totals ),
        stdOut( CATCH_MOVE(_stdOut) ),
        stdErr( CATCH_MOVE(_stdErr) ),
        aborting( _aborting )
    {}